

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O0

int dmy_to_mjd2000(int D,int M,int Y,int *mjd2000)

{
  int iVar1;
  int local_34;
  int local_30;
  int the_date;
  int transition;
  int TY;
  int TM;
  int TD;
  int *mjd2000_local;
  int Y_local;
  int M_local;
  int D_local;
  
  TY = 2;
  transition = 9;
  the_date = 0x6d8;
  _TM = mjd2000;
  mjd2000_local._0_4_ = Y;
  mjd2000_local._4_4_ = M;
  Y_local = D;
  iVar1 = dmy_to_mjd2000_julian(D,M,Y,&local_34);
  if ((iVar1 != 0) || (iVar1 = dmy_to_mjd2000_julian(2,9,0x6d8,&local_30), iVar1 != 0)) {
    return -1;
  }
  if (local_30 < local_34) {
    iVar1 = dmy_to_mjd2000_gregorian(Y_local,mjd2000_local._4_4_,(uint)mjd2000_local,&local_34);
    if (iVar1 != 0) {
      return -1;
    }
    if (local_34 + -0x24d96 <= local_30 + -0x256859) {
      coda_set_error(-0x68,"invalid date/time argument (%02d-%02d-%04d)",(ulong)(uint)Y_local,
                     (ulong)mjd2000_local._4_4_,(ulong)(uint)mjd2000_local);
      return -1;
    }
    *_TM = local_34 + -0x24d96;
  }
  else {
    *_TM = local_34 + -0x256859;
  }
  return 0;
}

Assistant:

static int dmy_to_mjd2000(int D, int M, int Y, int *mjd2000)
{
    const int TD = 2;
    const int TM = 9;
    const int TY = 1752;
    int transition;
    int the_date;

    if (dmy_to_mjd2000_julian(D, M, Y, &the_date) != 0 || dmy_to_mjd2000_julian(TD, TM, TY, &transition) != 0)
    {
        return -1;
    }

    if (the_date <= transition)
    {
        /* Julian calendar regime */
        *mjd2000 = the_date - 2451545;
    }
    else
    {
        /* Gregorian calendar regime */
        if (dmy_to_mjd2000_gregorian(D, M, Y, &the_date) != 0)
        {
            return -1;
        }

        if (the_date - 150934 <= transition - 2451545)
        {
            coda_set_error(CODA_ERROR_INVALID_DATETIME, "invalid date/time argument (%02d-%02d-%04d)", D, M, Y);
            return -1;
        }

        *mjd2000 = the_date - 150934;
    }

    return 0;
}